

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O0

uint Assimp::HexDigitToDecimal(char in)

{
  uint local_10;
  uint out;
  char in_local;
  
  local_10 = 0xffffffff;
  if ((in < '0') || ('9' < in)) {
    if ((in < 'a') || ('f' < in)) {
      if (('@' < in) && (in < 'G')) {
        local_10 = (int)in - 0x37;
      }
    }
    else {
      local_10 = (int)in - 0x57;
    }
  }
  else {
    local_10 = (int)in - 0x30;
  }
  return local_10;
}

Assistant:

inline
unsigned int HexDigitToDecimal(char in) {
    unsigned int out( UINT_MAX );
    if ( in >= '0' && in <= '9' ) {
        out = in - '0';
    } else if ( in >= 'a' && in <= 'f' ) {
        out = 10u + in - 'a';
    } else if ( in >= 'A' && in <= 'F' ) {
        out = 10u + in - 'A';
    }

    // return value is UINT_MAX if the input is not a hex digit
    return out;
}